

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwHideWindow(GLFWwindow *handle)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/src/window.c"
                  ,0x30d,"void glfwHideWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    XUnmapWindow(_glfw.x11.display,*(undefined8 *)(handle + 0x348));
    XFlush(_glfw.x11.display);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwHideWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformHideWindow(window);
}